

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::do_dynamic_link(CVmImageLoader *this)

{
  int iVar1;
  char *__s;
  vm_prop_id_t prop;
  vm_obj_id_t vVar2;
  size_t sVar3;
  CVmHashEntry *pCVar4;
  CVmImageLoader *this_00;
  undefined **ppuVar5;
  
  G_predef_X.stack_info_cls._0_2_ = 0;
  G_predef_X._18_8_ = 0;
  G_predef_X.rterr = 0;
  G_predef_X.rterrmsg_prop = 0;
  G_predef_X.obj_construct = 0;
  G_predef_X.obj_destruct = 0;
  G_predef_X.last_prop = 0;
  G_predef_X.obj_call_prop = 0;
  G_predef_X.prop_not_defined_prop = 0;
  G_predef_X.const_str_obj = 0;
  G_predef_X.const_lst_obj = 0;
  G_predef_X.last_prop_obj = 0;
  G_predef_X.storage_server_error = 0;
  G_predef_X.string_sth_flags = 0;
  G_predef_X.string_sth_tag = 0;
  G_predef_X.gramprod_first_tok = 0;
  G_predef_X.gramprod_last_tok = 0;
  G_predef_X.gramprod_token_list = 0;
  G_predef_X.gramprod_token_match_list = 0;
  G_predef_X.gramprod_tag = 0;
  G_predef_X.misc_vocab = 0;
  G_predef_X.gramprod_alt_props = 0;
  G_predef_X.gramprod_gram_alt_info = 0;
  G_predef_X.gramprod_gram_alt_tok_info = 0;
  G_predef_X.charset_unknown_exc = 0;
  G_predef_X.file_not_found_exc = 0;
  G_predef_X.file_creation_exc = 0;
  G_predef_X.file_open_exc = 0;
  G_predef_X.file_io_exc = 0;
  G_predef_X.file_sync_exc = 0;
  G_predef_X.file_closed_exc = 0;
  G_predef_X.file_mode_exc = 0;
  G_predef_X.file_safety_exc = 0;
  G_predef_X.filespec_getFilename = 0;
  G_predef_X.filespec_closeFile = 0;
  G_predef_X.file_info = 0;
  G_predef_X.compiler_exc = 0;
  G_predef_X.calc_hash_prop = 0;
  G_predef_X.match_values_prop = 0;
  G_predef_X.operator_add = 0;
  G_predef_X.operator_sub = 0;
  G_predef_X.operator_mul = 0;
  G_predef_X.operator_div = 0;
  G_predef_X.operator_mod = 0;
  G_predef_X.operator_xor = 0;
  G_predef_X.operator_shl = 0;
  G_predef_X.operator_ashr = 0;
  G_predef_X.operator_lshr = 0;
  G_predef_X.operator_bit_not = 0;
  G_predef_X.operator_bit_and = 0;
  G_predef_X.operator_bit_or = 0;
  G_predef_X.operator_neg = 0;
  G_predef_X.operator_idx = 0;
  G_predef_X.operator_setidx = 0;
  G_predef_X.net_exception = 0;
  G_predef_X.net_reset_exception = 0;
  G_predef_X.net_safety_exception = 0;
  G_predef_X.net_event = 0;
  G_predef_X.net_request_event = 0;
  G_predef_X.net_timeout_event = 0;
  G_predef_X.net_reply_event._0_2_ = 0;
  G_predef_X._182_6_ = 0;
  G_predef_X.file_upload_cl._0_2_ = 0;
  G_predef_X._190_8_ = 0;
  G_predef_X.reflection_services = 0;
  G_predef_X.reflection_valToSymbol = 0;
  G_predef_X.objToString = 0;
  ppuVar5 = &PTR_G_predef_X_0031cab0;
  this_00 = this;
  do {
    __s = ppuVar5[-2];
    if (__s == (char *)0x0) {
      if (G_predef_X.last_prop_obj == 0) {
        vVar2 = CVmObjVector::create(0,1);
        G_predef_X.last_prop_obj = vVar2;
        this_00 = this;
        add_synth_export_obj(this,"*LastPropObj",vVar2);
        set_last_prop(this_00,0);
      }
      if (G_predef_X.rterrmsg_prop == 0) {
        prop = alloc_new_prop(this_00);
        G_predef_X.rterrmsg_prop = prop;
        add_synth_export_prop(this,"exceptionMessage",prop);
      }
      if (G_predef_X.const_str_obj == 0) {
        vVar2 = CVmObjString::create(0,0);
        G_predef_X.const_str_obj = vVar2;
        add_synth_export_obj(this,"*ConstStrObj",vVar2);
      }
      if (G_predef_X.const_lst_obj == 0) {
        vVar2 = CVmObjList::create(0,0);
        G_predef_X.const_lst_obj = vVar2;
        add_synth_export_obj(this,"*ConstLstObj",vVar2);
        return;
      }
      return;
    }
    if (*(int *)(ppuVar5 + 1) == 0) {
      this_00 = (CVmImageLoader *)this->exports_;
      sVar3 = strlen(__s);
      pCVar4 = CVmHashTable::find((CVmHashTable *)this_00,__s,sVar3);
      if (pCVar4 == (CVmHashEntry *)0x0) goto LAB_00259947;
LAB_00259987:
      iVar1 = *(int *)(ppuVar5 + -1);
      if (iVar1 != *(int *)&pCVar4[1]._vptr_CVmHashEntry) {
        err_throw_a(0x14b,1,3,__s);
      }
      if (iVar1 == 0xc) {
LAB_002599a3:
        *(undefined4 *)*ppuVar5 = *(undefined4 *)&pCVar4[1].nxt_;
      }
      else if (iVar1 == 6) {
        *(undefined2 *)*ppuVar5 = *(undefined2 *)&pCVar4[1].nxt_;
      }
      else if (iVar1 == 5) goto LAB_002599a3;
    }
    else {
LAB_00259947:
      this_00 = (CVmImageLoader *)this->synth_exports_;
      sVar3 = strlen(__s);
      pCVar4 = CVmHashTable::find((CVmHashTable *)this_00,__s,sVar3);
      if (pCVar4 != (CVmHashEntry *)0x0) goto LAB_00259987;
    }
    ppuVar5 = ppuVar5 + 4;
  } while( true );
}

Assistant:

void CVmImageLoader::do_dynamic_link(VMG0_)
{
    struct sym_assoc_t
    {
        /* the symbol name */
        const char *sym;
        
        /* datatype */
        vm_datatype_t typ;
        
        /* address of predef table entry for this value */
        void *addr;

        /* 
         *   flag: this is a synthetic import, which means that we don't
         *   look for it in the image file, but only in the restored state 
         */
        int is_synthetic;
    };
    sym_assoc_t imports[] =
    {
        /* build the table by including the import list */
#define VM_IMPORT_OBJ(sym, mem)  { sym, VM_OBJ,  &G_predef->mem, FALSE },
#define VM_NOIMPORT_OBJ(sym, mem)  { sym, VM_OBJ,  &G_predef->mem, TRUE },
#define VM_IMPORT_PROP(sym, mem) { sym, VM_PROP, &G_predef->mem, FALSE },
#define VM_NOIMPORT_PROP(sym, mem) { sym, VM_PROP, &G_predef->mem, TRUE },
#define VM_IMPORT_FUNC(sym, mem) { sym, VM_FUNCPTR, &G_predef->mem, FALSE },
#include "vmimport.h"

        /* end the table */
        { 0, VM_NIL, 0, FALSE }
    };
    const sym_assoc_t *ip;

    /* reset all of the predefs to undefined */
    G_predef->reset();

    /*
     *   Run through our list of symbols to import from the load file, and
     *   load each one. 
     */
    for (ip = imports ; ip->sym != 0 ; ++ip)
    {
        CVmHashEntryExport *entry;

        /* presume we won't find it */
        entry = 0;

        /* 
         *   if it's not synthetic, look up this symbol in the image file's
         *   export table (don't look up synthetic symbols, because we
         *   always want to create these ourselves, not load them from an
         *   image file) 
         */
        if (!ip->is_synthetic)
        {
            /* it's a regular import - look for it in the image exports */
            entry = (CVmHashEntryExport *)exports_
                    ->find(ip->sym, strlen(ip->sym));
        }

        /* 
         *   if we didn't find the entry in the image file's exports, look
         *   in the synthesized exports, in case we're restoring state from
         *   a previous session 
         */
        if (entry == 0)
            entry = (CVmHashEntryExport *)synth_exports_
                    ->find(ip->sym, strlen(ip->sym));
        
        /* if the symbol isn't exported, skip it and proceed to the next */
        if (entry == 0)
            continue;

        /* 
         *   make sure the type of the symbol exported by the image file
         *   matches the type of value we want to import for the symbol 
         */
        if (ip->typ != entry->val_.typ)
        {
            /* the exported symbol has the wrong type - throw an error */
            err_throw_a(VMERR_INVAL_EXPORT_TYPE, 1, ERR_TYPE_CHAR, ip->sym);
        }

        /* set the value according to its type */
        switch(ip->typ)
        {
        case VM_OBJ:
            /* store the object value */
            *(vm_obj_id_t *)ip->addr = entry->val_.val.obj;
            break;

        case VM_PROP:
            *(vm_prop_id_t *)ip->addr = entry->val_.val.prop;
            break;

        case VM_FUNCPTR:
            *(pool_ofs_t *)ip->addr = entry->val_.val.ofs;
            break;

        default:
            /* we don't import any other types */
            break;
        }
    }

    /*
     *   If we don't already have one, create a vector to keep track of the
     *   last property ID allocated.  We store this in a vector object so
     *   that the property allocation mechanism easily integrates with the
     *   undo and save/restore mechanisms.  
     */
    if (G_predef->last_prop_obj == VM_INVALID_OBJ)
    {
        /* create the object */
        G_predef->last_prop_obj = CVmObjVector::create(vmg_ FALSE, 1);

        /* add it to the synthesized export list */
        add_synth_export_obj(VM_IMPORT_NAME_LASTPROPOBJ,
                             G_predef->last_prop_obj);

        /* 
         *   set up the object with the current last property, as indicated
         *   in the image file 
         */
        set_last_prop(vmg_ G_predef->last_prop);
    }

    /* 
     *   if the image didn't define an exceptionMessage property, allocate a
     *   new property ID for it 
     */
    if (G_predef->rterrmsg_prop == VM_INVALID_PROP)
    {
        /* allocate the property ID */
        G_predef->rterrmsg_prop = alloc_new_prop(vmg0_);

        /* add it to the synthesized export list */
        add_synth_export_prop(VM_IMPORT_NAME_RTERRMSG,
                              G_predef->rterrmsg_prop);
    }

    /* 
     *   Create the constant string and list placeholder objects - these are
     *   never imported from the image file, but must be dynamically created
     *   after loading is complete.
     *   
     *   Create these objects without values, since the values are
     *   irrelevant - they're needed only for their type information.  
     */
    if (G_predef->const_str_obj == VM_INVALID_OBJ)
    {
        /* allocate it */
        G_predef->const_str_obj = CVmObjString::create(vmg_ FALSE, 0);

        /* add it to the synthesized export list */
        add_synth_export_obj(VM_IMPORT_NAME_CONSTSTR,
                             G_predef->const_str_obj);
    }
    if (G_predef->const_lst_obj == VM_INVALID_OBJ)
    {
        /* allocate it */
        G_predef->const_lst_obj = CVmObjList::create(vmg_ FALSE, (size_t)0);

        /* add it to the synthesized export list */
        add_synth_export_obj(VM_IMPORT_NAME_CONSTLST,
                             G_predef->const_lst_obj);
    }
}